

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

size_t __thiscall wabt::anon_unknown_0::CWriter::BeginTry(CWriter *this,TryExpr *tryexpr)

{
  pointer *ppTVar1;
  _Alloc_hider *p_Var2;
  pointer pTVar3;
  pointer pTVar4;
  pointer pLVar5;
  size_t __n;
  size_type sVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  int iVar8;
  ulong uVar9;
  pointer pTVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *args;
  Newline *u;
  Newline *u_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u_01;
  Newline *args_1;
  ulong uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  size_t mark;
  string_view name;
  string tlabel;
  string local_70;
  pointer local_50;
  ulong local_48;
  long local_40;
  Block *local_38;
  
  Write();
  args_1 = (Newline *)0x1;
  name._M_str = (tryexpr->block).label._M_dataplus._M_p;
  name._M_len = (tryexpr->block).label._M_string_length;
  (anonymous_namespace)::CWriter::DefineLocalScopeName_abi_cxx11_
            (&local_70,(CWriter *)this,name,true);
  WriteData(this,"WASM_RT_UNWIND_TARGET *",0x17);
  WriteData(this,local_70._M_dataplus._M_p,local_70._M_string_length);
  WriteData(this,"_outer_target = wasm_rt_get_unwind_target();",0x2c);
  if (this->consecutive_newline_count_ < 2) {
    WriteData(this,"\n",1);
    this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
  }
  this->should_write_indent_next_ = true;
  WriteData(this,"WASM_RT_UNWIND_TARGET ",0x16);
  WriteData(this,local_70._M_dataplus._M_p,local_70._M_string_length);
  (anonymous_namespace)::CWriter::Write<char_const(&)[16],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [16])"_unwind_target;",u);
  WriteData(this,"if (!wasm_rt_try(",0x11);
  WriteData(this,local_70._M_dataplus._M_p,local_70._M_string_length);
  WriteData(this,"_unwind_target)) ",0x11);
  Write(this);
  DropTypes(this,(ulong)((long)*(pointer *)
                                ((long)&(tryexpr->block).decl.sig.param_types.
                                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                        _M_impl.super__Vector_impl_data + 8) -
                        (long)(tryexpr->block).decl.sig.param_types.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3 & 0xffffffff);
  local_40 = (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  local_38 = &tryexpr->block;
  PushLabel(this,Try,&(tryexpr->block).label,&(tryexpr->block).decl.sig,SUB81(args_1,0));
  std::vector<wabt::Type,std::allocator<wabt::Type>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<wabt::Type_const*,std::vector<wabt::Type,std::allocator<wabt::Type>>>>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&this->type_stack_,
             (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
             .super__Vector_impl_data._M_finish,
             (tryexpr->block).decl.sig.param_types.
             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_start,
             *(pointer *)
              ((long)&(tryexpr->block).decl.sig.param_types.
                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data + 8));
  WriteData(this,"wasm_rt_set_unwind_target(&",0x1b);
  WriteData(this,local_70._M_dataplus._M_p,local_70._M_string_length);
  (anonymous_namespace)::CWriter::Write<char_const(&)[17],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [17])"_unwind_target);",u_00);
  pTVar3 = (this->try_catch_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar4 = (this->try_catch_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)pTVar4 - (long)pTVar3 >> 4);
  uVar12 = (long)paVar11 * -0x5555555555555555;
  if (pTVar4 == (this->try_catch_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    if ((long)pTVar4 - (long)pTVar3 == 0x7fffffffffffffe0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar9 = 1;
    if (pTVar4 != pTVar3) {
      uVar9 = uVar12;
    }
    local_48 = uVar9 + uVar12;
    if (0x2aaaaaaaaaaaaa9 < local_48) {
      local_48 = 0x2aaaaaaaaaaaaaa;
    }
    if (CARRY8(uVar9,uVar12)) {
      local_48 = 0x2aaaaaaaaaaaaaa;
    }
    if (local_48 == 0) {
      local_50 = (pointer)0x0;
    }
    else {
      local_50 = (pointer)operator_new(local_48 * 0x30);
    }
    args = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)paVar11 * 0x10);
    p_Var2 = &(local_50->name)._M_dataplus + (long)paVar11 * 2;
    p_Var2->_M_p = (pointer)(p_Var2 + 2);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(&(local_50->name)._M_dataplus + (long)paVar11 * 2),
               local_70._M_dataplus._M_p,local_70._M_dataplus._M_p + local_70._M_string_length);
    uVar9 = local_48;
    p_Var2[4] = (_Alloc_hider)uVar12;
    *(undefined1 *)(p_Var2 + 5) = 0;
    pTVar10 = local_50;
    if (pTVar4 != pTVar3) {
      paVar11 = &(pTVar3->name).field_2;
      paVar7 = &(local_50->name).field_2;
      do {
        paVar13 = paVar7;
        (&paVar13->_M_allocated_capacity)[-2] = (size_type)paVar13;
        if (paVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*(char (**) [16])*(char (*) [16])(paVar11->_M_local_buf + -0x10)) {
          sVar6 = *(size_type *)(paVar11->_M_local_buf + 8);
          paVar13->_M_allocated_capacity = paVar11->_M_allocated_capacity;
          (&paVar13->_M_allocated_capacity)[1] = sVar6;
        }
        else {
          (&paVar13->_M_allocated_capacity)[-2] =
               (size_type)*(char (**) [16])*(char (*) [16])(paVar11->_M_local_buf + -0x10);
          paVar13->_M_allocated_capacity = paVar11->_M_allocated_capacity;
        }
        (&paVar13->_M_allocated_capacity)[-1] = *(size_type *)(paVar11->_M_local_buf + -8);
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)*(char (*) [16])(paVar11->_M_local_buf + -0x10) = paVar11;
        *(char *)((long)paVar11 + -8) = '\0';
        *(char *)((long)paVar11 + -7) = '\0';
        *(char *)((long)paVar11 + -6) = '\0';
        *(char *)((long)paVar11 + -5) = '\0';
        *(char *)((long)paVar11 + -4) = '\0';
        *(char *)((long)paVar11 + -3) = '\0';
        *(char *)((long)paVar11 + -2) = '\0';
        *(char *)((long)paVar11 + -1) = '\0';
        paVar11->_M_local_buf[0] = '\0';
        *(char *)(&paVar13->_M_allocated_capacity + 3) = paVar11->_M_local_buf[0x18];
        (&paVar13->_M_allocated_capacity)[2] =
             *(size_type *)*(char (*) [16])(paVar11->_M_local_buf + 0x10);
        args = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(paVar11->_M_local_buf + 0x30);
        pTVar10 = (pointer)(paVar11->_M_local_buf + 0x20);
        paVar11 = args;
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar13->_M_allocated_capacity + 6);
      } while (pTVar10 != pTVar4);
      pTVar10 = (pointer)(&paVar13->_M_allocated_capacity + 4);
    }
    if (pTVar3 != (pointer)0x0) {
      operator_delete(pTVar3,(long)(this->try_catch_stack_).
                                   super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar3
                     );
    }
    (this->try_catch_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
    ._M_impl.super__Vector_impl_data._M_start = local_50;
    (this->try_catch_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar10 + 1;
    (this->try_catch_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_50 + uVar9;
  }
  else {
    (pTVar4->name)._M_dataplus._M_p = (pointer)&(pTVar4->name).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pTVar4,local_70._M_dataplus._M_p,
               local_70._M_dataplus._M_p + local_70._M_string_length);
    pTVar4->try_catch_stack_size = uVar12;
    pTVar4->used = false;
    ppTVar1 = &(this->try_catch_stack_).
               super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
    args = paVar11;
  }
  mark = local_40 >> 3;
  Write(this,&(tryexpr->block).exprs);
  ResetTypeStack(this,mark);
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[16],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [27])&local_70,u_01,(char (*) [16])args,args_1);
  Write(this);
  WriteData(this," else ",6);
  Write(this);
  pLVar5 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __n = (pLVar5[-1].name)->_M_string_length;
  if (__n == (tryexpr->block).label._M_string_length) {
    if (__n != 0) {
      iVar8 = bcmp(((pLVar5[-1].name)->_M_dataplus)._M_p,(local_38->label)._M_dataplus._M_p,__n);
      if (iVar8 != 0) goto LAB_001a44e9;
    }
    if (pLVar5[-1].label_type == Try) {
      pLVar5[-1].label_type = Catch;
      if ((this->try_catch_stack_).
          super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].used == true) {
        WriteData(this,local_70._M_dataplus._M_p,local_70._M_string_length);
        WriteData(this,"_catch:;",8);
        if (this->consecutive_newline_count_ < 2) {
          WriteData(this,"\n",1);
          this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
        }
        this->should_write_indent_next_ = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      return mark;
    }
    __assert_fail("label_stack_.back().label_type == LabelType::Try",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                  ,0x9bb,"size_t wabt::(anonymous namespace)::CWriter::BeginTry(const TryExpr &)");
  }
LAB_001a44e9:
  __assert_fail("label_stack_.back().name == tryexpr.block.label",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                ,0x9ba,"size_t wabt::(anonymous namespace)::CWriter::BeginTry(const TryExpr &)");
}

Assistant:

size_t CWriter::BeginTry(const TryExpr& tryexpr) {
  Write(OpenBrace()); /* beginning of try-catch */
  const std::string tlabel = DefineLabelName(tryexpr.block.label);
  Write("WASM_RT_UNWIND_TARGET *", tlabel,
        "_outer_target = wasm_rt_get_unwind_target();", Newline());
  Write("WASM_RT_UNWIND_TARGET ", tlabel, "_unwind_target;", Newline());
  Write("if (!wasm_rt_try(", tlabel, "_unwind_target)) ");
  Write(OpenBrace()); /* beginning of try block */
  DropTypes(tryexpr.block.decl.GetNumParams());
  const size_t mark = MarkTypeStack();
  PushLabel(LabelType::Try, tryexpr.block.label, tryexpr.block.decl.sig);
  PushTypes(tryexpr.block.decl.sig.param_types);
  Write("wasm_rt_set_unwind_target(&", tlabel, "_unwind_target);", Newline());
  PushTryCatch(tlabel);
  Write(tryexpr.block.exprs);
  ResetTypeStack(mark);
  Write("wasm_rt_set_unwind_target(", tlabel, "_outer_target);", Newline());
  Write(CloseBrace());          /* end of try block */
  Write(" else ", OpenBrace()); /* beginning of catch blocks or delegate */
  assert(label_stack_.back().name == tryexpr.block.label);
  assert(label_stack_.back().label_type == LabelType::Try);
  label_stack_.back().label_type = LabelType::Catch;
  if (try_catch_stack_.back().used) {
    Write(tlabel, "_catch:;", Newline());
  }

  return mark;
}